

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_convolutiondepthwise_add(NetOptimize *this)

{
  uint _w;
  uint uVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  Layer *pLVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  Mat bias_data;
  Mat local_78;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar13 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    uVar14 = lVar13 >> 3;
    lVar13 = 0;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar13]->type);
      if (iVar9 == 0) {
        uVar11 = lVar13 + 1;
        uVar12 = uVar11;
        if (uVar11 < uVar14) {
          iVar9 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar13]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar10 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar11]->type);
            if (((iVar10 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar11],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 8)) &&
               (uVar12 = uVar11, *piVar4 == iVar9)) break;
            uVar11 = uVar11 + 1;
            uVar12 = uVar14;
          } while (uVar11 < uVar14);
        }
        if (uVar12 != uVar14) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[uVar12];
          if ((*(int *)&pLVar3[1]._vptr_Layer == 0) &&
             (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
            pLVar6 = ppLVar5[lVar13];
            uVar11 = 0;
            do {
              iVar9 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar11]->type);
              if ((iVar9 == 0) &&
                 (uVar15 = uVar11,
                 *((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11]->tops).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start ==
                 *(int *)(*(long *)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data + 4))) break;
              uVar11 = uVar11 + 1;
              uVar15 = uVar12;
            } while (uVar12 != uVar11);
            if (uVar15 != uVar12) {
              pLVar7 = (((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar15];
              _w = *(uint *)&pLVar6[1]._vptr_Layer;
              if ((*(uint *)&pLVar7[1]._vptr_Layer == _w) &&
                 (*(int *)((long)&pLVar7[1]._vptr_Layer + 4) == 0)) {
                iVar9._0_1_ = pLVar7[1].one_blob_only;
                iVar9._1_1_ = pLVar7[1].support_inplace;
                iVar9._2_1_ = pLVar7[1].support_vulkan;
                iVar9._3_1_ = pLVar7[1].support_packing;
                bVar16 = iVar9 == 0;
              }
              else {
                bVar16 = false;
              }
              if (((*(uint *)&pLVar7[1]._vptr_Layer == 1) &&
                  (*(int *)((long)&pLVar7[1]._vptr_Layer + 4) == 1)) &&
                 (uVar1._0_1_ = pLVar7[1].one_blob_only, uVar1._1_1_ = pLVar7[1].support_inplace,
                 uVar1._2_1_ = pLVar7[1].support_vulkan, uVar1._3_1_ = pLVar7[1].support_packing,
                 uVar1 == _w)) {
                bVar16 = true;
              }
              if (bVar16) {
                fprintf(_stderr,"fuse_convolutiondepthwise_add %s %s\n",
                        (pLVar6->name)._M_dataplus._M_p);
                ncnn::Mat::reshape(&local_78,(Mat *)&pLVar7[1].support_tensor_storage,_w,
                                   (Allocator *)0x0);
                if (*(int *)&pLVar6[1].type._M_dataplus._M_p == 0) {
                  *(undefined4 *)&pLVar6[1].type._M_dataplus._M_p = 1;
                  ncnn::Mat::operator=((Mat *)&pLVar6[2].support_tensor_storage,&local_78);
                }
                else if (0 < (int)_w) {
                  lVar8 = *(long *)&pLVar6[2].support_tensor_storage;
                  uVar11 = 0;
                  do {
                    *(float *)(lVar8 + uVar11 * 4) =
                         *(float *)(lVar8 + uVar11 * 4) +
                         *(float *)((long)local_78.data + uVar11 * 4);
                    uVar11 = uVar11 + 1;
                  } while (_w != uVar11);
                }
                iVar9 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = iVar9;
                (((this->super_ModelWriter).blobs)->
                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar9].producer = (int)lVar13;
                std::__cxx11::string::_M_replace
                          ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x32319a);
                piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    if (local_78.allocator == (Allocator *)0x0) {
                      if (local_78.data != (void *)0x0) {
                        free(local_78.data);
                      }
                    }
                    else {
                      (*(local_78.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_78.cstep = 0;
                local_78.data = (void *)0x0;
                local_78.refcount._0_4_ = 0;
                local_78.refcount._4_4_ = 0;
                local_78.elemsize._0_4_ = 0;
                local_78._20_8_ = 0;
                local_78.dims = 0;
                local_78.w = 0;
                local_78.h = 0;
                local_78.d = 0;
                local_78.c = 0;
              }
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != uVar14 + (uVar14 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BinaryOp to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolutiondepthwise->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolutiondepthwise_add %s %s\n", convolutiondepthwise->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolutiondepthwise->bias_term == 0)
            {
                // init bias
                convolutiondepthwise->bias_term = 1;
                convolutiondepthwise->bias_data = bias_data;
            }
            else
            {
                float* bias = convolutiondepthwise->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}